

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O0

void speak_file_to_file(OpenJTalk *openjtalk,FILE *fp)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  FILE *in_RSI;
  undefined8 in_RDI;
  size_t len;
  char line [260];
  char *str;
  char local_128 [272];
  char *local_18;
  FILE *local_10;
  undefined8 local_8;
  
  if (in_RSI != (FILE *)0x0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    uVar1 = getc(in_RSI);
    if ((((uVar1 & 0xff) != 0xef) || (uVar1 = getc(local_10), (uVar1 & 0xff) != 0xbb)) ||
       (uVar1 = getc(local_10), (uVar1 & 0xff) != 0xbf)) {
      fseek(local_10,0,0);
    }
    local_18 = (char *)malloc(0x105);
    strcpy(local_18,"");
    while (pcVar2 = fgets(local_128,0x104,local_10), pcVar2 != (char *)0x0) {
      remove_cr_lf(local_128);
      sVar3 = strlen(local_128);
      if (sVar3 != 0) {
        sVar3 = strlen(local_18);
        pcVar2 = local_18;
        sVar4 = strlen(local_128);
        local_18 = (char *)realloc(pcVar2,sVar3 + (long)(int)(uint)(sVar3 != 0) + sVar4 + 1);
        if (sVar3 != 0) {
          strcat(local_18," ");
        }
        strcat(local_18,local_128);
      }
    }
    openjtalk_speakToFile(local_8,local_18,outfile);
  }
  return;
}

Assistant:

void speak_file_to_file(OpenJTalk *openjtalk, FILE *fp)
{
	if (fp == NULL)
	{
		return;
	}

	if ((getc(fp) & 0xFF) != 0xEF || (getc(fp) & 0xFF) != 0xBB || (getc(fp) & 0xFF) != 0xBF)
	{
		fseek(fp, 0, SEEK_SET);
	}

	char *str = (char*)malloc(sizeof(char)*MAX_PATH + 1);
	strcpy(str, "");

	char line[MAX_PATH];
	while (fgets(line, MAX_PATH, fp) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			continue;
		}

		size_t len = strlen(str);
		str = (char*)realloc(str, len + (len>0 ? 1 : 0) + strlen(line) + 1);
		if (len > 0)
		{
			strcat(str, " ");
		}
		strcat(str, line);
	}

	openjtalk_speakToFile(openjtalk, str, outfile);
}